

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  ostream *os;
  ReporterConfig *_config_local;
  JunitReporter *this_local;
  
  CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,_config);
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__JunitReporter_0037e078;
  os = ReporterConfig::stream(_config);
  XmlWriter::XmlWriter(&this->xml,os);
  Timer::Timer(&this->suiteTimer);
  std::__cxx11::string::string((string *)&this->stdOutForSuite);
  std::__cxx11::string::string((string *)&this->stdErrForSuite);
  this->unexpectedExceptions = 0;
  this->m_okToFail = false;
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).m_reporterPrefs.shouldRedirectStdOut =
       true;
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).m_reporterPrefs.
  shouldReportAllAssertions = true;
  return;
}

Assistant:

JunitReporter::JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
            m_reporterPrefs.shouldReportAllAssertions = true;
        }